

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

int __thiscall
CVmObjLookupTable::getp_apply_all
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *key;
  uint *puVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  vm_val_t *pvVar6;
  int iVar7;
  CVmRun *this_00;
  uint uVar8;
  vm_val_t *old_entry_val;
  vm_rcdesc rc;
  vm_rcdesc local_78;
  
  if (getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_apply_all();
  }
  vm_rcdesc::init(&local_78,(EVP_PKEY_CTX *)"LookupTable.applyAll");
  iVar7 = CVmObject::get_prop_check_argc(retval,argc,&getp_apply_all::desc);
  pvVar6 = sp_;
  if (iVar7 == 0) {
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar6->val).obj = self;
    puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
    uVar8 = puVar1[1];
    if (uVar8 != 0) {
      old_entry_val = (vm_val_t *)(puVar1 + (ulong)*puVar1 * 2 + 0xc);
      do {
        pvVar5 = sp_;
        if (old_entry_val[-1].typ != VM_EMPTY) {
          key = old_entry_val + -1;
          uVar4 = *(undefined4 *)&old_entry_val->field_0x4;
          aVar2 = old_entry_val->val;
          sp_ = sp_ + 1;
          pvVar5->typ = old_entry_val->typ;
          *(undefined4 *)&pvVar5->field_0x4 = uVar4;
          pvVar5->val = aVar2;
          pvVar5 = sp_;
          uVar4 = *(undefined4 *)&key->field_0x4;
          aVar2 = old_entry_val[-1].val;
          sp_ = sp_ + 1;
          pvVar5->typ = key->typ;
          *(undefined4 *)&pvVar5->field_0x4 = uVar4;
          pvVar5->val = aVar2;
          this_00 = &G_interpreter_X;
          CVmRun::call_func_ptr(&G_interpreter_X,pvVar6 + -1,2,&local_78,0);
          add_undo_rec((CVmObjLookupTable *)this_00,self,LOOKUPTAB_UNDO_MOD,key,old_entry_val);
          aVar2 = r0_.val;
          uVar4 = r0_._4_4_;
          old_entry_val->typ = r0_.typ;
          *(undefined4 *)&old_entry_val->field_0x4 = uVar4;
          old_entry_val->val = aVar2;
        }
        old_entry_val = (vm_val_t *)&old_entry_val[2].val;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    sp_ = sp_ + -2;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_apply_all(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    vm_val_t *fn;
    vm_lookup_val *entry;
    static CVmNativeCodeDesc desc(1);
    uint i;
    vm_rcdesc rc(vmg_ "LookupTable.applyAll", self, 3, G_stk->get(0), argc);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the function to invoke is the top argument */
    fn = G_stk->get(0);

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* iterate over each entry */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* 
         *   if the entry is in use (it is if the key is non-empty), invoke
         *   the callback on it 
         */
        if (entry->key.typ != VM_EMPTY)
        {
            /* push the arguments - (key, val) - push in reverse order */
            G_stk->push(&entry->val);
            G_stk->push(&entry->key);
            
            /* invoke the callback */
            G_interpreter->call_func_ptr(vmg_ fn, 2, &rc, 0);
            
            /* replace this element with the result */
            set_entry_val_undo(vmg_ self, entry, G_interpreter->get_r0());
        }
    }

    /* discard the arguments and gc protection */
    G_stk->discard(2);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}